

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmChk<(moira::Instr)32,(moira::Mode)3,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  bool bVar1;
  StrWriter *pSVar2;
  Av<(moira::Instr)32,_(moira::Mode)3,_2> local_38;
  Ea<(moira::Mode)3,_2> src;
  
  src.pc = *addr;
  src.reg = op & 7;
  if (str->style->syntax != MUSASHI) {
    bVar1 = isAvailable(this,this->dasmModel,CHK,PI,2);
    if (!bVar1) {
      dasmIllegal<(moira::Instr)32,(moira::Mode)3,2>(this,str,addr,op);
      return;
    }
  }
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar2,&src);
  StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Dn)(op >> 9 & 7));
  local_38.ext1 = 0;
  StrWriter::operator<<(str,&local_38);
  return;
}

Assistant:

void
Moira::dasmChk(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    if (str.style.syntax != Syntax::MUSASHI && !isAvailable(dasmModel, I, M, S)) {

        addr = old;
        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    str << Av<I, M, S>{};
}